

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O3

bool __thiscall crnlib::data_stream::read_array(data_stream *this,vector<unsigned_char> *buf)

{
  int iVar1;
  uint min_new_capacity;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar4;
  
  uVar2 = buf->m_size;
  iVar1 = (*this->_vptr_data_stream[10])();
  if ((ulong)uVar2 < CONCAT44(extraout_var,iVar1)) {
    iVar1 = (*this->_vptr_data_stream[10])(this);
    if (0x40000000 < CONCAT44(extraout_var_00,iVar1)) {
      return false;
    }
    min_new_capacity = (*this->_vptr_data_stream[10])(this);
    uVar2 = buf->m_size;
    if (uVar2 != min_new_capacity) {
      if (uVar2 <= min_new_capacity) {
        if (buf->m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)buf,min_new_capacity,uVar2 + 1 == min_new_capacity,1,
                     (object_mover)0x0,false);
          uVar2 = buf->m_size;
        }
        memset(buf->m_p + uVar2,0,(ulong)(min_new_capacity - uVar2));
      }
      buf->m_size = min_new_capacity;
    }
  }
  iVar1 = (*this->_vptr_data_stream[10])(this);
  if (CONCAT44(extraout_var_01,iVar1) == 0) {
    bVar4 = true;
    if (buf->m_size != 0) {
      buf->m_size = 0;
    }
  }
  else {
    uVar3 = (*this->_vptr_data_stream[4])(this,buf->m_p,(ulong)buf->m_size);
    bVar4 = uVar3 == buf->m_size;
  }
  return bVar4;
}

Assistant:

bool data_stream::read_array(vector<uint8>& buf) {
  if (buf.size() < get_remaining()) {
    if (get_remaining() > 1024U * 1024U * 1024U)
      return false;

    buf.resize((uint)get_remaining());
  }

  if (!get_remaining()) {
    buf.resize(0);
    return true;
  }

  return read(&buf[0], buf.size()) == buf.size();
}